

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall QBlitterPaintEngine::drawRects(QBlitterPaintEngine *this,QRect *rects,int rectCount)

{
  long lVar1;
  bool bVar2;
  QBlitterPaintEnginePrivate *pQVar3;
  int in_EDX;
  QRect *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int i;
  QBlitterPaintEnginePrivate *d;
  bool in_stack_00000047;
  QColor *in_stack_00000048;
  QRectF *in_stack_00000050;
  QBlitterPaintEnginePrivate *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  QRect *pQVar5;
  QRect *in_stack_ffffffffffffffd8;
  QRasterPaintEngine *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  pQVar3 = d_func((QBlitterPaintEngine *)0x55cf23);
  iVar4 = (int)((ulong)pQVar5 >> 0x20);
  bVar2 = CapabilitiesToStateMask::canBlitterDrawRectMask((CapabilitiesToStateMask *)0x55cf39);
  if (bVar2) {
    for (iVar4 = 0; iVar4 < in_EDX; iVar4 = iVar4 + 1) {
      QRectF::QRectF((QRectF *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),in_RDI);
      QRasterPaintEngine::state((QRasterPaintEngine *)0x55cf80);
      qbrush_color((QBrush *)0x55cf8c);
      QBlitterPaintEnginePrivate::fillRect
                (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000047);
    }
  }
  else {
    QBlittablePlatformPixmap::markRasterOverlay(pQVar3->pmData,in_RSI,in_EDX);
    QRasterPaintEngine::drawRects(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,iVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBlitterPaintEngine::drawRects(const QRect *rects, int rectCount)
{
    Q_D(QBlitterPaintEngine);
    if (d->caps.canBlitterDrawRectMask()) {
        for (int i=0; i<rectCount; ++i)
            d->fillRect(rects[i], qbrush_color(state()->brush), false);
    } else {
        d->pmData->markRasterOverlay(rects, rectCount);
        QRasterPaintEngine::drawRects(rects, rectCount);
    }
}